

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O0

int __thiscall cmCTestScriptHandler::ProcessHandler(cmCTestScriptHandler *this)

{
  ulong uVar1;
  bool pscope;
  uint uVar2;
  size_type sVar3;
  reference in_path;
  reference rVar4;
  reference local_58;
  string local_48;
  ulong local_28;
  size_t i;
  cmCTestScriptHandler *pcStack_18;
  int res;
  cmCTestScriptHandler *this_local;
  
  i._4_4_ = 0;
  local_28 = 0;
  pcStack_18 = this;
  while( true ) {
    uVar1 = local_28;
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->ConfigurationScripts);
    if (sVar3 <= uVar1) break;
    in_path = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&this->ConfigurationScripts,local_28);
    cmsys::SystemTools::CollapseFullPath(&local_48,in_path);
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->ScriptProcessScope,local_28)
    ;
    local_58 = rVar4;
    pscope = std::_Bit_reference::operator_cast_to_bool(&local_58);
    uVar2 = RunConfigurationScript(this,&local_48,pscope);
    i._4_4_ = uVar2 | i._4_4_;
    std::__cxx11::string::~string((string *)&local_48);
    local_28 = local_28 + 1;
  }
  if (i._4_4_ == 0) {
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int cmCTestScriptHandler::ProcessHandler()
{
  int res = 0;
  for (size_t i = 0; i < this->ConfigurationScripts.size(); ++i) {
    // for each script run it
    res |= this->RunConfigurationScript(
      cmSystemTools::CollapseFullPath(this->ConfigurationScripts[i]),
      this->ScriptProcessScope[i]);
  }
  if (res) {
    return -1;
  }
  return 0;
}